

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderFloat
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,ProtoStreamObjectSource *os,
          Type *type,StringPiece field_name,ObjectWriter *ow)

{
  CodedInputStream *pCVar1;
  byte *pbVar2;
  uint32 *puVar3;
  uint32 uVar4;
  uint32 local_34 [2];
  uint32 buffer32;
  
  pCVar1 = this->stream_;
  pbVar2 = pCVar1->buffer_;
  if (pbVar2 < pCVar1->buffer_end_) {
    uVar4 = (uint32)*pbVar2;
    if ((char)*pbVar2 < '\0') goto LAB_00322b2d;
    pCVar1->buffer_ = pbVar2 + 1;
  }
  else {
    uVar4 = 0;
LAB_00322b2d:
    uVar4 = io::CodedInputStream::ReadTagFallback(pCVar1,uVar4);
  }
  pCVar1->last_tag_ = uVar4;
  local_34[0] = 0;
  if (uVar4 == 0) goto LAB_00322ba0;
  pCVar1 = this->stream_;
  puVar3 = (uint32 *)pCVar1->buffer_;
  if (*(int *)&pCVar1->buffer_end_ - (int)puVar3 < 4) {
    io::CodedInputStream::ReadLittleEndian32Fallback(pCVar1,local_34);
  }
  else {
    local_34[0] = *puVar3;
    pCVar1->buffer_ = (uint8 *)(puVar3 + 1);
  }
  pCVar1 = this->stream_;
  pbVar2 = pCVar1->buffer_;
  if (pbVar2 < pCVar1->buffer_end_) {
    uVar4 = (uint32)*pbVar2;
    if ((char)*pbVar2 < '\0') goto LAB_00322b8c;
    pCVar1->buffer_ = pbVar2 + 1;
  }
  else {
    uVar4 = 0;
LAB_00322b8c:
    uVar4 = io::CodedInputStream::ReadTagFallback(pCVar1,uVar4);
  }
  pCVar1->last_tag_ = uVar4;
LAB_00322ba0:
  (**(code **)(*(long *)field_name.length_ + 0x60))
            (local_34[0],(long *)field_name.length_,type,field_name.ptr_);
  Status::Status(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::RenderFloat(const ProtoStreamObjectSource* os,
                                            const google::protobuf::Type& type,
                                            StringPiece field_name,
                                            ObjectWriter* ow) {
  uint32 tag = os->stream_->ReadTag();
  uint32 buffer32 = 0;  // default value of Float wrapper value
  if (tag != 0) {
    os->stream_->ReadLittleEndian32(&buffer32);
    os->stream_->ReadTag();
  }
  ow->RenderFloat(field_name, bit_cast<float>(buffer32));
  return util::Status();
}